

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O2

void AI::evaluatePlan(Plan *plan,WorldState *currentState,WorldQuerier *worldQuerySystem,
                     TaskParameters *parameters,
                     vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
                     *satisfiablePredicates)

{
  TaskType TVar1;
  TaskIdentifier TVar2;
  TaskIdentifier *pTVar3;
  pointer pTVar4;
  Task *pTVar5;
  bool bVar6;
  long lVar7;
  Task *pTVar8;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pTVar8 = (plan->currentTask)._M_current;
  if (pTVar8->type != Simple) {
    bVar6 = Condition::isTrue(&pTVar8->preconditions,currentState,pTVar8,satisfiablePredicates,false
                             );
    if (bVar6) {
      WorldQuerier::getName_abi_cxx11_(&local_90,worldQuerySystem);
      std::__cxx11::string::string
                ((string *)&local_210,(string *)&((plan->currentTask)._M_current)->debugName);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
                ("[",&local_90,"] ","skipping non-simple task: ",&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_90);
      pTVar8 = (plan->currentTask)._M_current;
      if ((pTVar8->setup).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&)>::operator()
                  (&pTVar8->setup,pTVar8,currentState,worldQuerySystem);
        pTVar8 = (plan->currentTask)._M_current;
      }
      if ((pTVar8->loop).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&)>::operator()
                  (&pTVar8->loop,currentState,worldQuerySystem,pTVar8);
        pTVar8 = (plan->currentTask)._M_current;
      }
      (plan->currentTask)._M_current = pTVar8 + 1;
      if ((pTVar8[1].identifier != Null) &&
         (pTVar3 = (plan->currentPathVertex)._M_current, *pTVar3 != pTVar8[1].identifier)) {
        (plan->currentPathVertex)._M_current = pTVar3 + 1;
      }
      WorldQuerier::getName_abi_cxx11_(&local_b0,worldQuerySystem);
      std::__cxx11::string::string
                ((string *)&local_230,(string *)&((plan->currentTask)._M_current)->debugName);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
                ("[",&local_b0,"] ","Started task: ",&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_b0);
      pTVar8 = (plan->currentTask)._M_current;
      if ((pTVar8->setup).super__Function_base._M_manager == (_Manager_type)0x0) {
        return;
      }
      std::function<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&)>::operator()
                (&pTVar8->setup,pTVar8,currentState,worldQuerySystem);
      return;
    }
    WorldQuerier::getName_abi_cxx11_(&local_70,worldQuerySystem);
    std::__cxx11::string::string
              ((string *)&local_1f0,(string *)&((plan->currentTask)._M_current)->debugName);
    log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
              ("[",&local_70,"] ","Compound task: ",&local_1f0," preconditions were not met");
    std::__cxx11::string::~string((string *)&local_1f0);
    this = &local_70;
    goto LAB_0012f7b6;
  }
  bVar6 = Condition::isTrue(&pTVar8->postconditions,currentState,pTVar8,satisfiablePredicates,false)
  ;
  if (bVar6) {
LAB_0012f4fd:
    pTVar8 = (plan->currentTask)._M_current;
    if (pTVar8->failed == false) {
      WorldQuerier::getName_abi_cxx11_(&local_d0,worldQuerySystem);
      std::__cxx11::string::string
                ((string *)&local_250,(string *)&((plan->currentTask)._M_current)->debugName);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
                ("[",&local_d0,"] ","Finished task: ",&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_d0);
      pTVar8 = (plan->currentTask)._M_current;
      if ((pTVar8->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(AI::WorldState_&,_AI::Task_&)>::operator()
                  (&pTVar8->finish,currentState,pTVar8);
        pTVar8 = (plan->currentTask)._M_current;
      }
      lVar7 = (long)pTVar8->parentTaskIndex;
      if (lVar7 != -1) {
        pTVar4 = (plan->tasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar5 = pTVar4 + lVar7;
        TVar1 = pTVar4[lVar7].type;
        if (TVar1 == Compound) {
          if ((pTVar8->isLastInCompound == true) &&
             (bVar6 = Condition::isTrue(&pTVar5->postconditions,currentState,pTVar5,
                                        satisfiablePredicates,false), !bVar6)) {
            WorldQuerier::getName_abi_cxx11_(&local_110,worldQuerySystem);
            std::__cxx11::string::string((string *)&local_290,(string *)&pTVar5->debugName);
            log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                      ("[",&local_110,"] ","Compound task: ",&local_290,
                       " finished but its postconditions were not met");
            std::__cxx11::string::~string((string *)&local_290);
            this = &local_110;
            goto LAB_0012f7b6;
          }
        }
        else if (TVar1 == Recursive) {
          if (pTVar8->isLastInCompound == true) {
            bVar6 = Condition::isTrue(&pTVar5->postconditions,currentState,pTVar5,
                                      satisfiablePredicates,false);
            if (!bVar6) {
              if (0 < pTVar5->remainingRepeats) {
                pTVar5->remainingRepeats = pTVar5->remainingRepeats + -1;
                WorldQuerier::getName_abi_cxx11_(&local_130,worldQuerySystem);
                std::__cxx11::string::string((string *)&local_2b0,(string *)&pTVar5->debugName);
                log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                          ("[",&local_130,"] ","Recursive task: ",&local_2b0,
                           " finished, starting over since postconditions were not met");
                std::__cxx11::string::~string((string *)&local_2b0);
                std::__cxx11::string::~string((string *)&local_130);
                (plan->currentTask)._M_current =
                     (plan->tasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     ((plan->currentTask)._M_current)->parentTaskIndex;
                evaluatePlan(plan,currentState,worldQuerySystem,parameters,satisfiablePredicates);
                return;
              }
              WorldQuerier::getName_abi_cxx11_(&local_150,worldQuerySystem);
              std::__cxx11::string::string((string *)&local_2d0,(string *)&pTVar5->debugName);
              log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                        ("[",&local_150,"] ","Recursive task: ",&local_2d0,
                         " failed, postconditions not met and remainingRepeats");
              std::__cxx11::string::~string((string *)&local_2d0);
              this = &local_150;
              goto LAB_0012f7b6;
            }
            WorldQuerier::getName_abi_cxx11_(&local_170,worldQuerySystem);
            std::__cxx11::string::string((string *)&local_2f0,(string *)&pTVar5->debugName);
            log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                      ("[",&local_170,"] ","Recursive task: ",&local_2f0," has finished");
            std::__cxx11::string::~string((string *)&local_2f0);
            std::__cxx11::string::~string((string *)&local_170);
          }
        }
        else if ((TVar1 == Abstract) &&
                (bVar6 = Condition::isTrue(&pTVar5->postconditions,currentState,pTVar5,
                                           satisfiablePredicates,false), !bVar6)) {
          WorldQuerier::getName_abi_cxx11_(&local_f0,worldQuerySystem);
          std::__cxx11::string::string((string *)&local_270,(string *)&pTVar5->debugName);
          log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                    ("[",&local_f0,"] ","Abstract task: ",&local_270,
                     " finished but its postconditions are not met");
          std::__cxx11::string::~string((string *)&local_270);
          this = &local_f0;
          goto LAB_0012f7b6;
        }
      }
      pTVar5 = (plan->currentTask)._M_current;
      pTVar8 = pTVar5 + 1;
      if ((plan->tasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
          super__Vector_impl_data._M_finish <= pTVar8) {
        WorldQuerier::getName_abi_cxx11_(&local_50,worldQuerySystem);
        log<char_const*,std::__cxx11::string,char_const*,char_const*>
                  ("[",&local_50,"] ","Plan finished successfully");
        std::__cxx11::string::~string((string *)&local_50);
        plan->failed = false;
        plan->finished = true;
        return;
      }
      (plan->currentTask)._M_current = pTVar8;
      TVar2 = pTVar5[1].identifier;
      if ((TVar2 != Null) && (pTVar3 = (plan->currentPathVertex)._M_current, *pTVar3 != TVar2)) {
        (plan->currentPathVertex)._M_current = pTVar3 + 1;
      }
      WorldQuerier::getName_abi_cxx11_(&local_190,worldQuerySystem);
      std::__cxx11::string::string
                ((string *)&local_310,(string *)&((plan->currentTask)._M_current)->debugName);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
                ("[",&local_190,"] ","Started task: ",&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_190);
      pTVar8 = (plan->currentTask)._M_current;
      if ((pTVar8->setup).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&)>::operator()
                  (&pTVar8->setup,pTVar8,currentState,worldQuerySystem);
        pTVar8 = (plan->currentTask)._M_current;
      }
      bVar6 = Condition::isTrue(&pTVar8->preconditions,currentState,pTVar8,satisfiablePredicates,
                                false);
      if (bVar6) {
        return;
      }
      WorldQuerier::getName_abi_cxx11_(&local_1b0,worldQuerySystem);
      std::__cxx11::string::string
                ((string *)&local_330,(string *)&((plan->currentTask)._M_current)->debugName);
      log<char_const*,std::__cxx11::string,char_const*,std::__cxx11::string,char_const*>
                ("[",&local_1b0,"] ",&local_330," preconditions false, plan failed");
      std::__cxx11::string::~string((string *)&local_330);
      this = &local_1b0;
      goto LAB_0012f7b6;
    }
  }
  else {
    bVar6 = Condition::isEmpty(&((plan->currentTask)._M_current)->breakConditions);
    pTVar8 = (plan->currentTask)._M_current;
    if (!bVar6) {
      bVar6 = Condition::isTrue(&pTVar8->breakConditions,currentState,pTVar8,satisfiablePredicates,
                                false);
      if (bVar6) goto LAB_0012f4fd;
      pTVar8 = (plan->currentTask)._M_current;
    }
  }
  bVar6 = Condition::isTrue(&pTVar8->preconditions,currentState,pTVar8,satisfiablePredicates,false);
  if (((bVar6) && (pTVar8 = (plan->currentTask)._M_current, pTVar8->isImmediate == false)) &&
     (pTVar8->failed != true)) {
    return;
  }
  WorldQuerier::getName_abi_cxx11_(&local_1d0,worldQuerySystem);
  std::__cxx11::string::string
            ((string *)&local_350,(string *)&((plan->currentTask)._M_current)->debugName);
  log<char_const*,std::__cxx11::string,char_const*,std::__cxx11::string,char_const*>
            ("[",&local_1d0,"] ",&local_350," preconditions false, plan failed");
  std::__cxx11::string::~string((string *)&local_350);
  this = &local_1d0;
LAB_0012f7b6:
  std::__cxx11::string::~string((string *)this);
  plan->failed = true;
  return;
}

Assistant:

void evaluatePlan(Plan& plan, WorldState& currentState, WorldQuerier const& worldQuerySystem, TaskParameters& parameters, std::vector<SatisfiablePredicate>& satisfiablePredicates)
	{
		//is this an abstract or compound/.recursive task? they don't have any actions, so we can skip ahead		
		if (plan.currentTask->type != TaskType::Simple)			
		{
			if (!plan.currentTask->preconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates))
			{
				log("[", worldQuerySystem.getName(), "] ", "Compound task: ", plan.currentTask->debugName, " preconditions were not met");
				plan.failed = true;
				return;
			}

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
			log("[", worldQuerySystem.getName(), "] ", "skipping non-simple task: ", plan.currentTask->debugName);
#endif

			if (plan.currentTask->setup)
			{
				plan.currentTask->setup(*plan.currentTask, currentState, worldQuerySystem);
			}

			if (plan.currentTask->loop)
			{
				plan.currentTask->loop(currentState, worldQuerySystem, *plan.currentTask);
			}

			plan.currentTask++;	

			if (plan.currentTask->identifier != TaskIdentifier::Null
				&& *plan.currentPathVertex != plan.currentTask->identifier)
			{
				plan.currentPathVertex++;
			}

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
			log("[", worldQuerySystem.getName(), "] ", "Started task: ", plan.currentTask->debugName);
#endif

			if (plan.currentTask->setup)
			{
				plan.currentTask->setup(*plan.currentTask, currentState, worldQuerySystem);
			}

			return;
		}

		//are we done with the current task?
		if ((plan.currentTask->postconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates)
			|| (!plan.currentTask->breakConditions.isEmpty() && plan.currentTask->breakConditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates)))
			&& !plan.currentTask->failed)
		{	
#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
			log("[", worldQuerySystem.getName(), "] ", "Finished task: ", plan.currentTask->debugName);
#endif

			if (plan.currentTask->finish)
			{
				plan.currentTask->finish(currentState, *plan.currentTask);
			}

			//is this the last task in an abstract implementation or a compound task?
			if (plan.currentTask->parentTaskIndex != -1)
			{		
				auto& parent = plan.tasks[plan.currentTask->parentTaskIndex];		

				if (parent.type == TaskType::Abstract) 
				{
					if (!parent.postconditions.isTrue(currentState, parent, satisfiablePredicates))
					{
						log("[", worldQuerySystem.getName(), "] ", "Abstract task: ", parent.debugName, " finished but its postconditions are not met");
						plan.failed = true;

						return;
					}
				}
				else if (parent.type == TaskType::Compound && plan.currentTask->isLastInCompound) 
				{
					if (!parent.postconditions.isTrue(currentState, parent, satisfiablePredicates)) 
					{
						log("[", worldQuerySystem.getName(), "] ", "Compound task: ", parent.debugName, " finished but its postconditions were not met");
						plan.failed = true;

						return;
					}
				}
				else if (parent.type == TaskType::Recursive && plan.currentTask->isLastInCompound)
				{
					if (!parent.postconditions.isTrue(currentState, parent, satisfiablePredicates)) 
					{
						if (parent.remainingRepeats > 0)
						{
							parent.remainingRepeats--;

							log("[", worldQuerySystem.getName(), "] ", "Recursive task: ", parent.debugName, " finished, starting over since postconditions were not met");
							plan.currentTask = begin(plan.tasks) + plan.currentTask->parentTaskIndex;
							evaluatePlan(plan, currentState, worldQuerySystem, parameters, satisfiablePredicates);
						}
						else
						{
							log("[", worldQuerySystem.getName(), "] ", "Recursive task: ", parent.debugName, " failed, postconditions not met and remainingRepeats");
							plan.failed = true;
						}

						return;
					}
					else
					{
						log("[", worldQuerySystem.getName(), "] ", "Recursive task: ", parent.debugName, " has finished");
					}
				}				
			}

			//is there a next task?
			if ((plan.currentTask + 1) < end(plan.tasks))
			{
				//can we move to the next task?
				plan.currentTask++;

				if (plan.currentTask->identifier != TaskIdentifier::Null
					&& *plan.currentPathVertex != plan.currentTask->identifier)
				{
					plan.currentPathVertex++;
				}

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
				log("[", worldQuerySystem.getName(), "] ", "Started task: ", plan.currentTask->debugName);
#endif

				if (plan.currentTask->setup)
				{
					plan.currentTask->setup(*plan.currentTask, currentState, worldQuerySystem);
				}

				if (plan.currentTask->preconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates)) 
				{
					return;
				}
				else
				{
					log("[", worldQuerySystem.getName(), "] ", plan.currentTask->debugName, " preconditions false, plan failed");
					plan.failed = true;					
				}
			}
			else
			{

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
				log("[", worldQuerySystem.getName(), "] ", "Plan finished successfully");
#endif

				plan.failed = false;
				plan.finished = true;			
			}			
		}
		else
		{
			//can we still do this task?
			if (plan.currentTask->preconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates) 
				&& !plan.currentTask->isImmediate && !plan.currentTask->failed)
			{
				return;
			}
			else
			{
				log("[", worldQuerySystem.getName(), "] ", plan.currentTask->debugName, " preconditions false, plan failed");
				plan.failed = true;
			}
		}
	}